

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::deleteCols(Highs *this,HighsInt num_set_entries,HighsInt *set)

{
  HighsInt create_error;
  HighsStatus HVar1;
  allocator local_f1;
  string local_f0;
  HighsIndexCollection index_collection;
  HighsLogOptions local_80;
  
  if (num_set_entries == 0) {
    HVar1 = kOk;
  }
  else {
    clearDerivedModelProperties(this);
    index_collection.dimension_ = -1;
    index_collection.is_interval_ = false;
    index_collection.from_ = -1;
    index_collection.to_ = -2;
    index_collection.is_set_ = false;
    index_collection.set_num_entries_ = -1;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    index_collection._41_8_ = 0;
    create_error = create(&index_collection,num_set_entries,set,(this->model_).lp_.num_col_);
    if (create_error == 0) {
      deleteColsInterface(this,&index_collection);
      HVar1 = returnFromHighs(this,kOk);
    }
    else {
      HighsLogOptions::HighsLogOptions
                (&local_80,&(this->options_).super_HighsOptionsStruct.log_options);
      std::__cxx11::string::string((string *)&local_f0,"deleteCols",&local_f1);
      analyseSetCreateError
                (&local_80,&local_f0,create_error,false,num_set_entries,set,
                 (this->model_).lp_.num_col_);
      std::__cxx11::string::~string((string *)&local_f0);
      std::_Function_base::~_Function_base(&local_80.user_callback.super__Function_base);
      HVar1 = kError;
    }
    HighsIndexCollection::~HighsIndexCollection(&index_collection);
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::deleteCols(const HighsInt num_set_entries,
                              const HighsInt* set) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, num_set_entries, set, model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "deleteCols",
                                 create_error, false, num_set_entries, set,
                                 model_.lp_.num_col_);
  deleteColsInterface(index_collection);
  return returnFromHighs(HighsStatus::kOk);
}